

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerCells.cpp
# Opt level: O3

void __thiscall TRM::RasterizerCells::reset(RasterizerCells *this)

{
  pointer pCVar1;
  
  this->m_curr_block = 0;
  this->m_num_cells = 0;
  (this->m_curr_cell).x = 0x7fffffff;
  (this->m_curr_cell).y = 0x7fffffff;
  (this->m_curr_cell).cover = 0;
  (this->m_curr_cell).area = 0;
  pCVar1 = (this->m_cells).super__Vector_base<TRM::Cell,_std::allocator<TRM::Cell>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_cells).super__Vector_base<TRM::Cell,_std::allocator<TRM::Cell>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar1) {
    (this->m_cells).super__Vector_base<TRM::Cell,_std::allocator<TRM::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar1;
  }
  this->m_min_x = 0x7fffffff;
  this->m_max_x = -0x80000000;
  this->m_min_y = 0x7fffffff;
  this->m_max_y = -0x80000000;
  this->m_sorted = false;
  return;
}

Assistant:

void RasterizerCells::reset() {
  m_num_cells = 0;
  m_curr_block = 0;
  m_curr_cell.initial();
  m_cells.clear();
  m_min_x = std::numeric_limits<int32_t>::max();
  m_min_y = std::numeric_limits<int32_t>::max();
  m_max_x = std::numeric_limits<int32_t>::min();
  m_max_y = std::numeric_limits<int32_t>::min();
  m_sorted = false;
}